

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_tooltip(nk_context *ctx,char *text)

{
  float fVar1;
  float fVar2;
  float fVar3;
  nk_user_font *pnVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  float fVar8;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x631f,"void nk_tooltip(struct nk_context *, const char *)");
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x6320,"void nk_tooltip(struct nk_context *, const char *)");
  }
  if (ctx->current->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x6321,"void nk_tooltip(struct nk_context *, const char *)");
  }
  if (text == (char *)0x0) {
    __assert_fail("text",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x6322,"void nk_tooltip(struct nk_context *, const char *)");
  }
  fVar1 = (ctx->style).window.padding.x;
  if (*text == '\0') {
    lVar7 = 0;
  }
  else {
    lVar7 = 0;
    do {
      lVar5 = lVar7 + 1;
      lVar7 = lVar7 + 1;
    } while (text[lVar5] != '\0');
  }
  fVar2 = (ctx->style).window.padding.y;
  pnVar4 = (ctx->style).font;
  fVar8 = (*pnVar4->width)(pnVar4->userdata,pnVar4->height,text,(int)lVar7);
  fVar3 = ((ctx->style).font)->height;
  iVar6 = nk_tooltip_begin(ctx,fVar8 + fVar1 * 4.0);
  if (iVar6 == 0) {
    return;
  }
  nk_row_layout(ctx,NK_DYNAMIC,fVar2 + fVar2 + fVar3,1,0);
  nk_text_colored(ctx,text,(int)lVar7,0x11,(ctx->style).text.color);
  nk_tooltip_end(ctx);
  return;
}

Assistant:

NK_API void
nk_tooltip(struct nk_context *ctx, const char *text)
{
    const struct nk_style *style;
    struct nk_vec2 padding;

    int text_len;
    float text_width;
    float text_height;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    NK_ASSERT(text);
    if (!ctx || !ctx->current || !ctx->current->layout || !text)
        return;

    /* fetch configuration data */
    style = &ctx->style;
    padding = style->window.padding;

    /* calculate size of the text and tooltip */
    text_len = nk_strlen(text);
    text_width = style->font->width(style->font->userdata,
                    style->font->height, text, text_len);
    text_width += (4 * padding.x);
    text_height = (style->font->height + 2 * padding.y);

    /* execute tooltip and fill with text */
    if (nk_tooltip_begin(ctx, (float)text_width)) {
        nk_layout_row_dynamic(ctx, (float)text_height, 1);
        nk_text(ctx, text, text_len, NK_TEXT_LEFT);
        nk_tooltip_end(ctx);
    }
}